

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc_sse2.c
# Opt level: O0

void TM4_SSE2(uint8_t *dst,uint8_t *top)

{
  uint32_t uVar1;
  uint8_t *in_RSI;
  uint8_t *in_RDI;
  short sVar2;
  short sVar3;
  short sVar4;
  __m128i out;
  __m128i base;
  int val;
  int y;
  __m128i top_base;
  __m128i top_values;
  __m128i zero;
  short local_120;
  int local_11c;
  uint8_t *local_e0;
  byte local_68;
  byte bStack_67;
  byte bStack_66;
  byte bStack_65;
  ushort uStack_36;
  ushort uStack_34;
  ushort uStack_32;
  
  uVar1 = WebPMemToUint32(in_RSI);
  local_68 = (byte)uVar1;
  bStack_67 = (byte)(uVar1 >> 8);
  bStack_66 = (byte)(uVar1 >> 0x10);
  bStack_65 = (byte)(uVar1 >> 0x18);
  local_e0 = in_RDI;
  for (local_11c = 0; local_11c < 4; local_11c = local_11c + 1) {
    local_120 = (ushort)in_RSI[-2 - local_11c] - (ushort)in_RSI[-1];
    uStack_36 = (ushort)bStack_67;
    uStack_34 = (ushort)bStack_66;
    uStack_32 = (ushort)bStack_65;
    sVar2 = local_120 + (ushort)local_68;
    sVar3 = local_120 + uStack_36;
    sVar4 = local_120 + uStack_34;
    local_120 = local_120 + uStack_32;
    WebPUint32ToMem(local_e0,CONCAT13((0 < local_120) * (local_120 < 0x100) * (char)local_120 -
                                      (0xff < local_120),
                                      CONCAT12((0 < sVar4) * (sVar4 < 0x100) * (char)sVar4 -
                                               (0xff < sVar4),
                                               CONCAT11((0 < sVar3) * (sVar3 < 0x100) * (char)sVar3
                                                        - (0xff < sVar3),
                                                        (0 < sVar2) * (sVar2 < 0x100) * (char)sVar2
                                                        - (0xff < sVar2)))));
    local_e0 = local_e0 + 0x20;
  }
  return;
}

Assistant:

static WEBP_INLINE void TM4_SSE2(uint8_t* dst, const uint8_t* top) {
  const __m128i zero = _mm_setzero_si128();
  const __m128i top_values = _mm_cvtsi32_si128(WebPMemToUint32(top));
  const __m128i top_base = _mm_unpacklo_epi8(top_values, zero);
  int y;
  for (y = 0; y < 4; ++y, dst += BPS) {
    const int val = top[-2 - y] - top[-1];
    const __m128i base = _mm_set1_epi16(val);
    const __m128i out = _mm_packus_epi16(_mm_add_epi16(base, top_base), zero);
    WebPUint32ToMem(dst, _mm_cvtsi128_si32(out));
  }
}